

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O2

void testMinMaxEigenValue<Imath_2_5::Matrix33<float>>(Matrix33<float> *A)

{
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  long lVar4;
  BaseType_conflict1 BVar5;
  TV maxV;
  TV minV;
  TV S;
  Matrix33<float> A1;
  Matrix33<float> V;
  Matrix33<float> U;
  Vec3 local_e0 [12];
  Vec3 local_d4 [12];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  float local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  undefined4 local_68;
  undefined8 uStack_64;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 local_44;
  undefined8 uStack_40;
  undefined4 uStack_38;
  undefined4 local_34;
  undefined4 uStack_30;
  undefined8 uStack_2c;
  undefined4 local_24;
  
  uStack_30 = 0;
  uStack_2c = 0;
  uStack_40 = 0;
  uStack_38 = 0;
  local_44 = 0x3f800000;
  local_34 = 0x3f800000;
  local_24 = 0x3f800000;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_64 = 0;
  uStack_5c = 0;
  local_68 = 0x3f800000;
  local_58 = 0x3f800000;
  local_48 = 0x3f800000;
  BVar5 = computeThreshold<Imath_2_5::Matrix33<float>>(A);
  local_78 = A->x[2][2];
  local_98 = *(undefined8 *)A->x[0];
  uStack_90 = *(undefined8 *)(A->x[0] + 2);
  local_88 = *(undefined8 *)(A->x[1] + 1);
  uStack_80 = *(undefined8 *)A->x[2];
  Imath_2_5::minEigenVector<Imath_2_5::Matrix33<float>,Imath_2_5::Vec3<float>>
            ((Matrix33 *)&local_98,local_d4);
  local_a8 = A->x[2][2];
  local_c8 = *(undefined8 *)A->x[0];
  uStack_c0 = *(undefined8 *)(A->x[0] + 2);
  local_b8 = *(undefined8 *)(A->x[1] + 1);
  uStack_b0 = *(undefined8 *)A->x[2];
  Imath_2_5::maxEigenVector<Imath_2_5::Matrix33<float>,Imath_2_5::Vec3<float>>
            ((Matrix33 *)&local_c8,local_e0);
  local_78 = A->x[2][2];
  local_98 = *(undefined8 *)A->x[0];
  uStack_90 = *(undefined8 *)(A->x[0] + 2);
  local_88 = *(undefined8 *)(A->x[1] + 1);
  uStack_80 = *(undefined8 *)A->x[2];
  lVar4 = 0;
  Imath_2_5::jacobiSVD<float>
            ((Matrix33 *)&local_98,(Matrix33 *)&local_44,(Vec3 *)&local_c8,(Matrix33 *)&local_68,
             1.1920929e-07,false);
  pfVar3 = (float *)((long)&uStack_64 + 4);
  while( true ) {
    if (lVar4 == 3) {
      return;
    }
    if (BVar5 <= ABS(*(float *)(local_d4 + lVar4 * 4) - *pfVar3)) break;
    lVar2 = lVar4 * 4;
    pfVar1 = pfVar3 + -2;
    lVar4 = lVar4 + 1;
    pfVar3 = pfVar3 + 3;
    if (BVar5 <= ABS(*(float *)(local_e0 + lVar2) - *pfVar1)) {
      __assert_fail("abs(maxV[i]-V[i][0]) < threshold",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                    ,0xbb,"void testMinMaxEigenValue(const TM &) [TM = Imath_2_5::Matrix33<float>]")
      ;
    }
  }
  __assert_fail("abs(minV[i]-V[i][dim - 1]) < threshold",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                ,0xba,"void testMinMaxEigenValue(const TM &) [TM = Imath_2_5::Matrix33<float>]");
}

Assistant:

void
testMinMaxEigenValue(const TM& A)
{
  typedef typename TM::BaseVecType TV;
  typedef typename TM::BaseType T;

  TV minV, maxV, S;
  TM U, V;
  
  const T threshold = computeThreshold(A);

  {
      TM A1(A);
      minEigenVector(A1, minV);
      TM A2(A);
      maxEigenVector(A2, maxV);
  }
  {
      TM A3(A);
      jacobiSVD(A3, U, S, V);
  }

  const int dim = TM::dimensions();

  for(int i = 0; i < dim; ++i) {
      assert(abs(minV[i]-V[i][dim - 1]) < threshold);
      assert(abs(maxV[i]-V[i][0]) < threshold);
  }
}